

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::
basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
::int_writer<int,fmt::v6::basic_format_specs<char>>::dec_writer::operator()
          (dec_writer *this,char **it)

{
  char *pcVar1;
  char *in_RSI;
  int in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  
  pcVar1 = format_decimal<char,char*,unsigned_int>
                     (in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  *(char **)in_RSI = pcVar1;
  return;
}

Assistant:

void operator()(It&& it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }